

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O2

void __thiscall cxx03_digest_test::test_method(cxx03_digest_test *this)

{
  string str;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  digest_type hash;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char *local_18;
  
  hash = cryptox::digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>>("Hello world!");
  cryptox::to_hex<std::array<unsigned_char,16ul>>(&str,(cryptox *)&hash,hash._M_elems._8_8_);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x1d);
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_002b7238;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_18 = "";
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
            (&local_30,&local_70,0x1d,1,2,&str,"str","86fb269d190d2c85f6e0468ceca42a20",
             "\"86fb269d190d2c85f6e0468ceca42a20\"");
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cxx03_digest_test) {
	const md5::digest_type hash = digest<md5>("Hello world!");
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "86fb269d190d2c85f6e0468ceca42a20");
}